

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtt.c
# Opt level: O0

vtt_block_t * vtt_block_free_head(vtt_block_t *head)

{
  vtt_block_t *pvVar1;
  undefined8 *in_RDI;
  vtt_block_t *next;
  
  pvVar1 = (vtt_block_t *)*in_RDI;
  if (in_RDI[5] != 0) {
    free((void *)in_RDI[5]);
  }
  if (in_RDI[4] != 0) {
    free((void *)in_RDI[4]);
  }
  free(in_RDI);
  return pvVar1;
}

Assistant:

vtt_block_t* vtt_block_free_head(vtt_block_t* head)
{
    vtt_block_t* next = head->next;
    if (head->cue_id != NULL) {
        free(head->cue_id);
    }
    if (head->cue_settings != NULL) {
        free(head->cue_settings);
    }
    free(head);
    return next;
}